

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O2

int colfromatomload(t_atom *colatom)

{
  char *__nptr;
  int iVar1;
  ushort **ppuVar2;
  long lVar3;
  uint uVar4;
  t_float tVar5;
  
  if (colatom->a_type == A_SYMBOL) {
    ppuVar2 = __ctype_b_loc();
    __nptr = ((colatom->a_w).w_symbol)->s_name;
    lVar3 = (long)*__nptr;
    if ((lVar3 != 0x2d) && (((*ppuVar2)[lVar3] & 0x800) == 0)) goto LAB_0012e082;
    uVar4 = atoi(__nptr);
  }
  else {
    if (colatom->a_type != A_FLOAT) {
LAB_0012e082:
      iVar1 = iemgui_getcolorarg(0,1,colatom);
      return iVar1;
    }
    tVar5 = atom_getfloat(colatom);
    uVar4 = (uint)tVar5;
  }
  if ((int)uVar4 < 0) {
    uVar4 = ~uVar4;
    iVar1 = ((uVar4 & 0xfc0) << 4 | (uVar4 & 0x3f000) << 6) + (uVar4 & 0x3f) * 4;
  }
  else {
    uVar4 = iemgui_modulo_color(uVar4);
    iVar1 = iemgui_color_hex[uVar4];
  }
  return iVar1;
}

Assistant:

static int colfromatomload(t_atom*colatom)
{
    int color;
        /* old-fashioned color argument, either a number or symbol
        evaluating to an integer */
    if (colatom->a_type == A_FLOAT)
        color = atom_getfloat(colatom);
    else if (colatom->a_type == A_SYMBOL &&
        (isdigit(colatom->a_w.w_symbol->s_name[0]) ||
            colatom->a_w.w_symbol->s_name[0] == '-'))
                color = atoi(colatom->a_w.w_symbol->s_name);

        /* symbolic color */
    else return (iemgui_getcolorarg(0, 1, colatom));
    if (color < 0)
    {
        color = -1 - color;
        color = ((color & 0x3f000) << 6)|((color & 0xfc0) << 4)|
            ((color & 0x3f) << 2);
    }
    else
    {
        color = iemgui_modulo_color(color);
        color = iemgui_color_hex[color];
    }
    return (color);
}